

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformValue::streamValue
          (UniformValue *this,ostringstream *str,int arrayElement,int column)

{
  int iVar1;
  ostream *poVar2;
  pair<int,_int> pVar3;
  pointer pfVar4;
  pointer piVar5;
  int elem_1;
  int elem;
  int iVar6;
  int iVar7;
  long lVar8;
  
  pVar3 = (this->type).size;
  poVar2 = std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&(this->type).refStrType);
  std::operator<<(poVar2,"(");
  if ((this->type).baseType == 0x82e6) {
    lVar8 = 0;
    do {
      if (lVar8 != 0) {
        if (lVar8 == 4) goto LAB_00bdf224;
        std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      std::ostream::operator<<
                (str,(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[(arrayElement << 2) + lVar8]);
      lVar8 = lVar8 + 1;
    } while( true );
  }
  iVar7 = pVar3.first * arrayElement * pVar3.second;
  iVar6 = 0;
  while( true ) {
    pfVar4 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVar3 = (this->type).size;
    iVar1 = pVar3.first;
    if (((this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish == pfVar4) || (iVar1 <= iVar6)) break;
    if (iVar6 != 0) {
      std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      iVar1 = (this->type).size.first;
      pfVar4 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    poVar2 = (ostream *)std::ostream::operator<<(str,pfVar4[iVar1 * column + iVar7 + iVar6]);
    std::operator<<(poVar2,".0");
    iVar6 = iVar6 + 1;
  }
  for (lVar8 = 0;
      (piVar5 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
      (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5 && (lVar8 < pVar3.first)); lVar8 = lVar8 + 1) {
    if (lVar8 != 0) {
      std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      piVar5 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    std::ostream::operator<<(str,piVar5[(int)lVar8 + iVar7]);
    pVar3 = (this->type).size;
  }
  for (lVar8 = 0;
      (piVar5 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
      (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5 && (lVar8 < pVar3.first)); lVar8 = lVar8 + 1) {
    if (lVar8 != 0) {
      std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      piVar5 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    poVar2 = (ostream *)std::ostream::operator<<(str,piVar5[iVar7 + (int)lVar8]);
    std::operator<<(poVar2,"u");
    pVar3 = (this->type).size;
  }
LAB_00bdf224:
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,")");
  return;
}

Assistant:

void streamValue(std::ostringstream& str, int arrayElement = 0, int column = 0) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;

		str << type.refStr() << "(";

		if (type.getBaseType() == GL_SAMPLER)
		{
			for (size_t elem = 0; elem < 4; elem++)
			{
				if (elem)
					str << ", ";
				str << fValues[arrayElement * 4 + elem];
			}
			str << ")";
			return;
		}

		for (int elem = 0; fValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << fValues[arrayElement * arrayElementSize + column * type.getSize().first + elem] << ".0";
		}
		for (int elem = 0; iValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << iValues[arrayElement * arrayElementSize + elem];
		}
		for (int elem = 0; uValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << uValues[arrayElement * arrayElementSize + elem] << "u";
		}
		str << ")";
	}